

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

bool __thiscall node::anon_unknown_2::MinerImpl::isTestChain(MinerImpl *this)

{
  long lVar1;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x398,"chainman","m_node.chainman");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ((((puVar2->_M_t).
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).
           chainparams)->m_chain_type != MAIN;
  }
  __stack_chk_fail();
}

Assistant:

bool isTestChain() override
    {
        return chainman().GetParams().IsTestChain();
    }